

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-hand.cpp
# Opt level: O0

int __thiscall mahjong::PlayerHand::bonusTileCount(PlayerHand *this,WiningState *state)

{
  bool bVar1;
  int iVar2;
  reference pTVar3;
  reference this_00;
  Meld *it_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<mahjong::Meld,_std::allocator<mahjong::Meld>_> *__range1_1;
  iterator iStack_38;
  Tile it;
  iterator __end1;
  iterator __begin1;
  multiset<mahjong::Tile,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_> *__range1;
  int bonus_tile_count;
  WiningState *state_local;
  PlayerHand *this_local;
  
  __range1._4_4_ = 0;
  __end1 = std::multiset<mahjong::Tile,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>::
           begin(&this->tiles);
  iStack_38 = std::multiset<mahjong::Tile,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
              ::end(&this->tiles);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    pTVar3 = std::_Rb_tree_const_iterator<mahjong::Tile>::operator*(&__end1);
    iVar2 = WiningState::bonusTileCount(state,*pTVar3);
    __range1._4_4_ = iVar2 + __range1._4_4_;
    std::_Rb_tree_const_iterator<mahjong::Tile>::operator++(&__end1);
  }
  __end1_1 = std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::begin(&this->melds);
  it_1 = (Meld *)std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::end(&this->melds);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_mahjong::Meld_*,_std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>_>
                        *)&it_1);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_mahjong::Meld_*,_std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>_>
              ::operator*(&__end1_1);
    iVar2 = Meld::bonusTileCount(this_00,state);
    __range1._4_4_ = iVar2 + __range1._4_4_;
    __gnu_cxx::
    __normal_iterator<const_mahjong::Meld_*,_std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>_>
    ::operator++(&__end1_1);
  }
  return __range1._4_4_;
}

Assistant:

int PlayerHand::bonusTileCount(const WiningState& state) const
{
	auto bonus_tile_count = 0;

	for (auto it : tiles)
	{
		bonus_tile_count += state.bonusTileCount(it);
	}

	for (const auto& it : melds)
	{
		bonus_tile_count += it.bonusTileCount(state);
	}

	return bonus_tile_count;
}